

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::DeactivateScriptPubKeyMan(CWallet *this,uint256 id,OutputType type,bool internal)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar1;
  ScriptPubKeyMan *pSVar2;
  string *__str;
  WalletDatabase *pWVar3;
  runtime_error *this_00;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_01;
  long in_FS_OFFSET;
  undefined8 uStack_c8;
  WalletBatch local_c0;
  undefined4 uStack_b0;
  OutputType type_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff58;
  string local_88 [32];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  type_local = type;
  pSVar2 = GetScriptPubKeyMan(this,&type_local,internal);
  if (pSVar2 != (ScriptPubKeyMan *)0x0) {
    (*pSVar2->_vptr_ScriptPubKeyMan[0x1a])(&local_48,pSVar2);
    bVar1 = ::operator==((base_blob<256U> *)&local_48,(base_blob<256U> *)&id);
    if (bVar1) {
      base_blob<256u>::ToString_abi_cxx11_(&local_68,(base_blob<256u> *)&id);
      __str = FormatOutputType_abi_cxx11_(type_local);
      std::__cxx11::string::string(local_88,__str);
      parameters._M_string_length =
           (size_type)
           local_c0.m_batch._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      parameters._M_dataplus._M_p = (pointer)uStack_c8;
      parameters.field_2._M_allocated_capacity = (size_type)local_c0.m_database;
      parameters.field_2._8_4_ = uStack_b0;
      parameters.field_2._12_4_ = type_local;
      WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,char_const*>
                (this,"Deactivate spkMan: id = %s, type = %s, internal = %s\n",parameters,
                 in_stack_ffffffffffffff58,(char *)&local_68);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)&local_68);
      pWVar3 = GetDatabase(this);
      (*pWVar3->_vptr_WalletDatabase[0xe])(&local_c0,pWVar3,1);
      local_c0.m_database = pWVar3;
      bVar1 = WalletBatch::EraseActiveScriptPubKeyMan(&local_c0,(undefined1)type_local,internal);
      if (!bVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xffffffffffffff58,"DeactivateScriptPubKeyMan",
                   (allocator<char> *)((long)&uStack_c8 + 7));
        std::operator+(&local_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff58,": erasing active ScriptPubKeyMan id failed");
        std::runtime_error::runtime_error(this_00,(string *)&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001536df;
      }
      this_01 = &this->m_external_spk_managers;
      if (internal) {
        this_01 = &this->m_internal_spk_managers;
      }
      std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
      ::erase(&this_01->_M_t,&type_local);
      if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
          local_c0.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_c0.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
    }
  }
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&this->NotifyCanGetAddressesChanged);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001536df:
  __stack_chk_fail();
}

Assistant:

void CWallet::DeactivateScriptPubKeyMan(uint256 id, OutputType type, bool internal)
{
    auto spk_man = GetScriptPubKeyMan(type, internal);
    if (spk_man != nullptr && spk_man->GetID() == id) {
        WalletLogPrintf("Deactivate spkMan: id = %s, type = %s, internal = %s\n", id.ToString(), FormatOutputType(type), internal ? "true" : "false");
        WalletBatch batch(GetDatabase());
        if (!batch.EraseActiveScriptPubKeyMan(static_cast<uint8_t>(type), internal)) {
            throw std::runtime_error(std::string(__func__) + ": erasing active ScriptPubKeyMan id failed");
        }

        auto& spk_mans = internal ? m_internal_spk_managers : m_external_spk_managers;
        spk_mans.erase(type);
    }

    NotifyCanGetAddressesChanged();
}